

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O2

assetsys_error_t
assetsys_file_load(assetsys_t *sys,assetsys_file_t f,int *size,void *buffer,int capacity)

{
  assetsys_internal_mount_t *paVar1;
  char *__dest;
  assetsys_internal_mount_t *paVar2;
  uint uVar3;
  mz_bool mVar4;
  char *pcVar5;
  FILE *__stream;
  long lVar6;
  size_t sVar7;
  assetsys_internal_file_t *paVar8;
  int iVar9;
  
  uVar3 = assetsys_internal_find_mount_index(sys,f.mount,f.path);
  if ((int)uVar3 < 0) {
    return ASSETSYS_ERROR_INVALID_MOUNT;
  }
  paVar2 = sys->mounts;
  paVar1 = paVar2 + uVar3;
  paVar8 = paVar2[uVar3].files + f.index;
  if (paVar2[uVar3].type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP) {
    iVar9 = paVar8->size;
    if (size != (int *)0x0) {
      *size = iVar9;
    }
    if (iVar9 <= capacity) {
      mVar4 = mz_zip_reader_extract_to_mem_no_alloc
                        (&paVar1->zip,paVar8->zip_index,buffer,(long)iVar9,0,(void *)0x0,0);
      return (uint)(mVar4 != 0) * 5 + ASSETSYS_ERROR_FAILED_TO_READ_FILE;
    }
  }
  else {
    if (size != (int *)0x0) {
      *size = paVar8->size;
    }
    __dest = sys->temp;
    pcVar5 = strpool_cstr(&sys->strpool,paVar1->path);
    strcpy(__dest,pcVar5);
    pcVar5 = "/";
    if (sys->temp[0] == '\0') {
      pcVar5 = "";
    }
    strcat(__dest,pcVar5);
    pcVar5 = strpool_cstr(&sys->strpool,sys->collated[paVar8->collated_index].path);
    strcat(__dest,pcVar5 + (long)paVar1->mount_len + 1);
    __stream = fopen(__dest,"rb");
    if (__stream == (FILE *)0x0) {
      return ASSETSYS_ERROR_FAILED_TO_READ_FILE;
    }
    fseek(__stream,0,2);
    lVar6 = ftell(__stream);
    fseek(__stream,0,0);
    iVar9 = (int)lVar6;
    if (size != (int *)0x0) {
      *size = iVar9;
    }
    if (iVar9 <= capacity) {
      sVar7 = fread(buffer,1,(long)iVar9,__stream);
      fclose(__stream);
      return (uint)((int)sVar7 == iVar9) * 5 + ASSETSYS_ERROR_FAILED_TO_READ_FILE;
    }
    fclose(__stream);
  }
  return ASSETSYS_ERROR_BUFFER_TOO_SMALL;
}

Assistant:

assetsys_error_t assetsys_file_load( assetsys_t* sys, assetsys_file_t f, int* size, void* buffer, int capacity )
    {
    int mount_index = assetsys_internal_find_mount_index( sys, f.mount, f.path );
    if( mount_index < 0 ) return ASSETSYS_ERROR_INVALID_MOUNT;

    struct assetsys_internal_mount_t* mount = &sys->mounts[ mount_index ];
    struct assetsys_internal_file_t* file = &mount->files[ f.index ];
    if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP )
        {
        if( size ) *size = (int) file->size;
        if( file->size > capacity ) return ASSETSYS_ERROR_BUFFER_TOO_SMALL;

        mz_bool result = mz_zip_reader_extract_to_mem_no_alloc( &mount->zip, (mz_uint) file->zip_index, buffer, 
            (size_t) file->size, 0, 0, 0 ); 
        return result ? ASSETSYS_SUCCESS : ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        }
    else
        {
        if( size ) *size = file->size;
        strcpy( sys->temp, assetsys_internal_get_string( sys, mount->path ) );
        strcat( sys->temp, *sys->temp == '\0' ? "" : "/" );
        strcat( sys->temp, assetsys_internal_get_string( sys, 
            sys->collated[ file->collated_index ].path ) + mount->mount_len + 1 );
        FILE* fp = fopen( sys->temp, "rb" );
        if( !fp ) return ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        
        fseek( fp, 0, SEEK_END );
        int file_size = (int) ftell( fp );
        fseek( fp, 0, SEEK_SET );
        if( size ) *size = file_size;

        if( file_size > capacity ) { fclose( fp ); return ASSETSYS_ERROR_BUFFER_TOO_SMALL; }

        int size_read = (int) fread( buffer, 1, (size_t) file_size, fp );
        fclose( fp );
        if( size_read != file_size ) return ASSETSYS_ERROR_FAILED_TO_READ_FILE;

        return ASSETSYS_SUCCESS;
        }
    }